

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# world.cpp
# Opt level: O3

void __thiscall World::AdminReport(World *this,Character *from,string *reportee,string *message)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  size_t *psVar2;
  pointer ppCVar3;
  Character *pCVar4;
  Board *pBVar5;
  pointer pcVar6;
  pointer pcVar7;
  _List_node_base *p_Var8;
  _Alloc_hider _Var9;
  string *str;
  World *pWVar10;
  bool bVar11;
  short sVar12;
  int iVar13;
  int iVar14;
  uint uVar15;
  mapped_type *pmVar16;
  undefined8 *puVar17;
  long *plVar18;
  ulong uVar19;
  _List_node_base *p_Var20;
  time_t tVar21;
  _List_node_base *p_Var22;
  long *plVar23;
  size_type *psVar24;
  Database *this_00;
  undefined8 uVar25;
  _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
  *this_01;
  pointer ppCVar26;
  string chat_log_dump;
  string local_170;
  Character *local_150;
  long *local_148;
  undefined8 local_140;
  long local_138;
  undefined8 uStack_130;
  long *local_128;
  long local_120;
  long local_118;
  long lStack_110;
  string local_108;
  string local_e8;
  string local_c8;
  _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
  *local_a8;
  string *local_a0;
  World *local_98;
  string *local_90;
  PacketBuilder builder;
  Database_Result local_50;
  
  chat_log_dump._M_dataplus._M_p = (pointer)&chat_log_dump.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&chat_log_dump,"ChatMaxWidth","");
  pmVar16 = std::__detail::
            _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
            ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                          *)&this->config,&chat_log_dump);
  iVar13 = util::variant::GetInt(pmVar16);
  (*(from->super_Command_Source)._vptr_Command_Source[2])(&local_e8,from);
  util::ucfirst(&local_108,&local_e8);
  puVar17 = (undefined8 *)std::__cxx11::string::append((char *)&local_108);
  local_148 = &local_138;
  plVar18 = puVar17 + 2;
  if ((long *)*puVar17 == plVar18) {
    local_138 = *plVar18;
    uStack_130 = puVar17[3];
  }
  else {
    local_138 = *plVar18;
    local_148 = (long *)*puVar17;
  }
  local_140 = puVar17[1];
  *puVar17 = plVar18;
  puVar17[1] = 0;
  *(undefined1 *)(puVar17 + 2) = 0;
  plVar18 = (long *)std::__cxx11::string::_M_append
                              ((char *)&local_148,(ulong)(reportee->_M_dataplus)._M_p);
  local_128 = &local_118;
  plVar23 = plVar18 + 2;
  if ((long *)*plVar18 == plVar23) {
    local_118 = *plVar23;
    lStack_110 = plVar18[3];
  }
  else {
    local_118 = *plVar23;
    local_128 = (long *)*plVar18;
  }
  local_120 = plVar18[1];
  *plVar18 = (long)plVar23;
  plVar18[1] = 0;
  *(undefined1 *)(plVar18 + 2) = 0;
  local_150 = from;
  local_a0 = reportee;
  plVar18 = (long *)std::__cxx11::string::append((char *)&local_128);
  psVar24 = (size_type *)(plVar18 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar18 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar24) {
    local_170.field_2._M_allocated_capacity = *psVar24;
    local_170.field_2._8_8_ = plVar18[3];
    local_170._M_dataplus._M_p = (pointer)&local_170.field_2;
  }
  else {
    local_170.field_2._M_allocated_capacity = *psVar24;
    local_170._M_dataplus._M_p = (pointer)*plVar18;
  }
  local_170._M_string_length = plVar18[1];
  *plVar18 = (long)psVar24;
  plVar18[1] = 0;
  *(undefined1 *)(plVar18 + 2) = 0;
  iVar14 = util::text_width(&local_170);
  local_c8._M_dataplus._M_p = (pointer)&local_c8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_c8,"...","");
  util::text_cap((string *)&builder,message,iVar13 - iVar14,&local_c8);
  std::__cxx11::string::operator=((string *)message,(string *)&builder);
  if ((size_type *)builder._0_8_ != &builder.data._M_string_length) {
    operator_delete((void *)builder._0_8_,builder.data._M_string_length + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
    operator_delete(local_c8._M_dataplus._M_p,local_c8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_170._M_dataplus._M_p != &local_170.field_2) {
    operator_delete(local_170._M_dataplus._M_p,local_170.field_2._M_allocated_capacity + 1);
  }
  str = local_a0;
  if (local_128 != &local_118) {
    operator_delete(local_128,local_118 + 1);
  }
  if (local_148 != &local_138) {
    operator_delete(local_148,local_138 + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_108._M_dataplus._M_p != &local_108.field_2) {
    operator_delete(local_108._M_dataplus._M_p,local_108.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e8._M_dataplus._M_p != &local_e8.field_2) {
    operator_delete(local_e8._M_dataplus._M_p,local_e8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)chat_log_dump._M_dataplus._M_p != &chat_log_dump.field_2) {
    operator_delete(chat_log_dump._M_dataplus._M_p,
                    CONCAT71(chat_log_dump.field_2._M_allocated_capacity._1_7_,
                             chat_log_dump.field_2._M_local_buf[0]) + 1);
  }
  (*(local_150->super_Command_Source)._vptr_Command_Source[2])(&chat_log_dump);
  PacketBuilder::PacketBuilder
            (&builder,PACKET_ADMININTERACT,PACKET_REPLY,
             str->_M_string_length + chat_log_dump._M_string_length + message->_M_string_length + 5)
  ;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)chat_log_dump._M_dataplus._M_p != &chat_log_dump.field_2) {
    operator_delete(chat_log_dump._M_dataplus._M_p,
                    CONCAT71(chat_log_dump.field_2._M_allocated_capacity._1_7_,
                             chat_log_dump.field_2._M_local_buf[0]) + 1);
  }
  local_a8 = (_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
              *)&this->config;
  PacketBuilder::AddChar(&builder,2);
  PacketBuilder::AddByte(&builder,0xff);
  (*(local_150->super_Command_Source)._vptr_Command_Source[2])(&chat_log_dump);
  PacketBuilder::AddBreakString(&builder,&chat_log_dump,0xff);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)chat_log_dump._M_dataplus._M_p != &chat_log_dump.field_2) {
    operator_delete(chat_log_dump._M_dataplus._M_p,
                    CONCAT71(chat_log_dump.field_2._M_allocated_capacity._1_7_,
                             chat_log_dump.field_2._M_local_buf[0]) + 1);
  }
  PacketBuilder::AddBreakString(&builder,message,0xff);
  PacketBuilder::AddBreakString(&builder,str,0xff);
  ppCVar26 = (this->characters).super__Vector_base<Character_*,_std::allocator<Character_*>_>.
             _M_impl.super__Vector_impl_data._M_start;
  ppCVar3 = (this->characters).super__Vector_base<Character_*,_std::allocator<Character_*>_>._M_impl
            .super__Vector_impl_data._M_finish;
  local_98 = this;
  local_90 = message;
  if (ppCVar26 != ppCVar3) {
    do {
      pCVar4 = *ppCVar26;
      uVar15 = (**(pCVar4->super_Command_Source)._vptr_Command_Source)(pCVar4);
      chat_log_dump._M_dataplus._M_p = (pointer)&chat_log_dump.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&chat_log_dump,"reports","");
      pmVar16 = std::__detail::
                _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                              *)&this->admin_config,&chat_log_dump);
      iVar13 = util::variant::GetInt(pmVar16);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)chat_log_dump._M_dataplus._M_p != &chat_log_dump.field_2) {
        operator_delete(chat_log_dump._M_dataplus._M_p,
                        CONCAT71(chat_log_dump.field_2._M_allocated_capacity._1_7_,
                                 chat_log_dump.field_2._M_local_buf[0]) + 1);
      }
      if (iVar13 <= (int)(uVar15 & 0xff)) {
        Character::Send(pCVar4,&builder);
      }
      ppCVar26 = ppCVar26 + 1;
    } while (ppCVar26 != ppCVar3);
  }
  chat_log_dump._M_dataplus._M_p = (pointer)&chat_log_dump.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&chat_log_dump,"AdminBoard","");
  this_01 = local_a8;
  pmVar16 = std::__detail::
            _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
            ::operator[](local_a8,&chat_log_dump);
  paVar1 = &local_170.field_2;
  iVar13 = util::variant::GetInt(pmVar16);
  pWVar10 = local_98;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)chat_log_dump._M_dataplus._M_p != &chat_log_dump.field_2) {
    operator_delete(chat_log_dump._M_dataplus._M_p,
                    CONCAT71(chat_log_dump.field_2._M_allocated_capacity._1_7_,
                             chat_log_dump.field_2._M_local_buf[0]) + 1);
  }
  uVar19 = (ulong)(short)((short)iVar13 + -1);
  if (7 < uVar19) goto LAB_0019a1c3;
  chat_log_dump._M_dataplus._M_p = (pointer)&chat_log_dump.field_2;
  chat_log_dump._M_string_length = 0;
  chat_log_dump.field_2._M_local_buf[0] = '\0';
  pBVar5 = (pWVar10->boards)._M_elems[uVar19];
  p_Var20 = (_List_node_base *)operator_new(0x78);
  p_Var20->_M_prev = (_List_node_base *)&p_Var20[1]._M_prev;
  p_Var20[1]._M_next = (_List_node_base *)0x0;
  *(undefined1 *)&p_Var20[1]._M_prev = 0;
  p_Var20[3]._M_next = p_Var20 + 4;
  p_Var20[3]._M_prev = (_List_node_base *)0x0;
  *(undefined1 *)&p_Var20[4]._M_next = 0;
  p_Var20[5]._M_next = p_Var20 + 6;
  p_Var20[5]._M_prev = (_List_node_base *)0x0;
  *(undefined1 *)&p_Var20[6]._M_next = 0;
  sVar12 = (short)*(undefined4 *)&pBVar5->last_id + 1;
  pBVar5->last_id = sVar12;
  *(short *)&p_Var20->_M_next = sVar12;
  (*(local_150->super_Command_Source)._vptr_Command_Source[2])(&local_170);
  std::__cxx11::string::operator=((string *)&p_Var20->_M_prev,(string *)&local_170);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_170._M_dataplus._M_p != paVar1) {
    operator_delete(local_170._M_dataplus._M_p,local_170.field_2._M_allocated_capacity + 1);
  }
  pCVar4 = local_150;
  *(uint *)&p_Var20[2]._M_prev = (uint)local_150->admin;
  local_108._M_dataplus._M_p = (pointer)&local_108.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_108," [Report] ","");
  (*(pCVar4->super_Command_Source)._vptr_Command_Source[2])(&local_c8,pCVar4);
  util::ucfirst(&local_e8,&local_c8);
  uVar25 = 0xf;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_108._M_dataplus._M_p != &local_108.field_2) {
    uVar25 = local_108.field_2._M_allocated_capacity;
  }
  if ((ulong)uVar25 < local_e8._M_string_length + local_108._M_string_length) {
    uVar25 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_e8._M_dataplus._M_p != &local_e8.field_2) {
      uVar25 = local_e8.field_2._M_allocated_capacity;
    }
    if ((ulong)uVar25 < local_e8._M_string_length + local_108._M_string_length) goto LAB_00199d6d;
    puVar17 = (undefined8 *)
              std::__cxx11::string::replace
                        ((ulong)&local_e8,0,(char *)0x0,(ulong)local_108._M_dataplus._M_p);
  }
  else {
LAB_00199d6d:
    puVar17 = (undefined8 *)
              std::__cxx11::string::_M_append((char *)&local_108,(ulong)local_e8._M_dataplus._M_p);
  }
  plVar18 = puVar17 + 2;
  if ((long *)*puVar17 == plVar18) {
    local_138 = *plVar18;
    uStack_130 = puVar17[3];
    local_148 = &local_138;
  }
  else {
    local_138 = *plVar18;
    local_148 = (long *)*puVar17;
  }
  local_140 = puVar17[1];
  *puVar17 = plVar18;
  puVar17[1] = 0;
  *(undefined1 *)plVar18 = 0;
  plVar18 = (long *)std::__cxx11::string::append((char *)&local_148);
  local_128 = &local_118;
  plVar23 = plVar18 + 2;
  if ((long *)*plVar18 == plVar23) {
    local_118 = *plVar23;
    lStack_110 = plVar18[3];
  }
  else {
    local_118 = *plVar23;
    local_128 = (long *)*plVar18;
  }
  local_120 = plVar18[1];
  *plVar18 = (long)plVar23;
  plVar18[1] = 0;
  *(undefined1 *)(plVar18 + 2) = 0;
  plVar18 = (long *)std::__cxx11::string::_M_append
                              ((char *)&local_128,(ulong)(local_a0->_M_dataplus)._M_p);
  psVar24 = (size_type *)(plVar18 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar18 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar24) {
    local_170.field_2._M_allocated_capacity = *psVar24;
    local_170.field_2._8_8_ = plVar18[3];
    local_170._M_dataplus._M_p = (pointer)paVar1;
  }
  else {
    local_170.field_2._M_allocated_capacity = *psVar24;
    local_170._M_dataplus._M_p = (pointer)*plVar18;
  }
  local_170._M_string_length = plVar18[1];
  *plVar18 = (long)psVar24;
  plVar18[1] = 0;
  *(undefined1 *)(plVar18 + 2) = 0;
  std::__cxx11::string::operator=((string *)(p_Var20 + 3),(string *)&local_170);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_170._M_dataplus._M_p != paVar1) {
    operator_delete(local_170._M_dataplus._M_p,local_170.field_2._M_allocated_capacity + 1);
  }
  if (local_128 != &local_118) {
    operator_delete(local_128,local_118 + 1);
  }
  if (local_148 != &local_138) {
    operator_delete(local_148,local_138 + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e8._M_dataplus._M_p != &local_e8.field_2) {
    operator_delete(local_e8._M_dataplus._M_p,local_e8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
    operator_delete(local_c8._M_dataplus._M_p,local_c8.field_2._M_allocated_capacity + 1);
  }
  p_Var22 = p_Var20 + 5;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_108._M_dataplus._M_p != &local_108.field_2) {
    operator_delete(local_108._M_dataplus._M_p,local_108.field_2._M_allocated_capacity + 1);
  }
  std::__cxx11::string::_M_assign((string *)p_Var22);
  p_Var8 = (_List_node_base *)Timer::GetTime();
  p_Var20[7]._M_next = p_Var8;
  local_170._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_170,"ReportChatLogSize","");
  pmVar16 = std::__detail::
            _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
            ::operator[](this_01,&local_170);
  iVar13 = util::variant::GetInt(pmVar16);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_170._M_dataplus._M_p != paVar1) {
    operator_delete(local_170._M_dataplus._M_p,local_170.field_2._M_allocated_capacity + 1);
  }
  if (0 < iVar13) {
    Character::GetChatLogDump_abi_cxx11_(&local_170,local_150);
    std::__cxx11::string::operator=((string *)&chat_log_dump,(string *)&local_170);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_170._M_dataplus._M_p != paVar1) {
      operator_delete(local_170._M_dataplus._M_p,local_170.field_2._M_allocated_capacity + 1);
    }
    std::__cxx11::string::append((char *)p_Var22);
    std::__cxx11::string::_M_append((char *)p_Var22,(ulong)chat_log_dump._M_dataplus._M_p);
  }
  local_170._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_170,"LogReports","");
  pmVar16 = std::__detail::
            _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
            ::operator[](this_01,&local_170);
  bVar11 = util::variant::GetBool(pmVar16);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_170._M_dataplus._M_p != paVar1) {
    operator_delete(local_170._M_dataplus._M_p,local_170.field_2._M_allocated_capacity + 1);
  }
  if (bVar11) {
    (*(local_150->super_Command_Source)._vptr_Command_Source[2])();
    _Var9._M_p = local_170._M_dataplus._M_p;
    this_00 = &local_98->db;
    pcVar6 = (local_a0->_M_dataplus)._M_p;
    pcVar7 = (local_90->_M_dataplus)._M_p;
    tVar21 = time((time_t *)0x0);
    Database::Query(&local_50,this_00,
                    "INSERT INTO `reports` (`reporter`, `reported`, `reason`, `time`, `chat_log`) VALUES (\'$\', \'$\', \'$\', #, \'$\')"
                    ,_Var9._M_p,pcVar6,pcVar7,tVar21,chat_log_dump._M_dataplus._M_p);
    std::
    vector<std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>_>,_std::allocator<std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>_>_>_>
    ::~vector(&local_50.
               super_vector<std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>_>,_std::allocator<std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>_>_>_>
             );
    this_01 = local_a8;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_170._M_dataplus._M_p != &local_170.field_2) {
      operator_delete(local_170._M_dataplus._M_p,local_170.field_2._M_allocated_capacity + 1);
    }
  }
  p_Var22 = (_List_node_base *)operator_new(0x18);
  p_Var22[1]._M_next = p_Var20;
  std::__detail::_List_node_base::_M_hook(p_Var22);
  uVar19 = (pBVar5->posts).super__List_base<Board_Post_*,_std::allocator<Board_Post_*>_>._M_impl.
           _M_node._M_size + 1;
  (pBVar5->posts).super__List_base<Board_Post_*,_std::allocator<Board_Post_*>_>._M_impl._M_node.
  _M_size = uVar19;
  local_170._M_dataplus._M_p = (pointer)&local_170.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_170,"AdminBoardLimit","");
  pmVar16 = std::__detail::
            _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
            ::operator[](this_01,&local_170);
  iVar13 = util::variant::GetInt(pmVar16);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_170._M_dataplus._M_p != &local_170.field_2) {
    operator_delete(local_170._M_dataplus._M_p,local_170.field_2._M_allocated_capacity + 1);
  }
  if ((ulong)(long)iVar13 < uVar19) {
    p_Var20 = (pBVar5->posts).super__List_base<Board_Post_*,_std::allocator<Board_Post_*>_>._M_impl.
              _M_node.super__List_node_base._M_prev;
    psVar2 = &(pBVar5->posts).super__List_base<Board_Post_*,_std::allocator<Board_Post_*>_>._M_impl.
              _M_node._M_size;
    *psVar2 = *psVar2 - 1;
    std::__detail::_List_node_base::_M_unhook();
    operator_delete(p_Var20,0x18);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)chat_log_dump._M_dataplus._M_p != &chat_log_dump.field_2) {
    operator_delete(chat_log_dump._M_dataplus._M_p,
                    CONCAT71(chat_log_dump.field_2._M_allocated_capacity._1_7_,
                             chat_log_dump.field_2._M_local_buf[0]) + 1);
  }
LAB_0019a1c3:
  PacketBuilder::~PacketBuilder(&builder);
  return;
}

Assistant:

void World::AdminReport(Character *from, std::string reportee, std::string message)
{
	message = util::text_cap(message, static_cast<int>(this->config["ChatMaxWidth"]) - util::text_width(util::ucfirst(from->SourceName()) + "  reports: " + reportee + ", "));

	PacketBuilder builder(PACKET_ADMININTERACT, PACKET_REPLY, 5 + from->SourceName().length() + message.length() + reportee.length());
	builder.AddChar(2); // message type
	builder.AddByte(255);
	builder.AddBreakString(from->SourceName());
	builder.AddBreakString(message);
	builder.AddBreakString(reportee);

	UTIL_FOREACH(this->characters, character)
	{
		if (character->SourceAccess() >= static_cast<int>(this->admin_config["reports"]))
		{
			character->Send(builder);
		}
	}

	short boardid = static_cast<int>(this->config["AdminBoard"]) - 1;

	if (static_cast<std::size_t>(boardid) < this->boards.size())
	{
		std::string chat_log_dump;
		Board *admin_board = this->boards[boardid];

		Board_Post *newpost = new Board_Post;
		newpost->id = ++admin_board->last_id;
		newpost->author = from->SourceName();
		newpost->author_admin = from->admin;
		newpost->subject = std::string(" [Report] ") + util::ucfirst(from->SourceName()) + " reports: " + reportee;
		newpost->body = message;
		newpost->time = Timer::GetTime();

		if (int(this->config["ReportChatLogSize"]) > 0)
		{
			chat_log_dump = from->GetChatLogDump();
			newpost->body += "\r\n\r\n";
			newpost->body += chat_log_dump;
		}

		if (this->config["LogReports"])
		{
			try
			{
				this->db.Query("INSERT INTO `reports` (`reporter`, `reported`, `reason`, `time`, `chat_log`) VALUES ('$', '$', '$', #, '$')",
					from->SourceName().c_str(),
					reportee.c_str(),
					message.c_str(),
					int(std::time(0)),
					chat_log_dump.c_str()
				);
			}
			catch (Database_Exception& e)
			{
				Console::Err("Could not save report to database.");
				Console::Err("%s", e.error());
			}
		}

		admin_board->posts.push_front(newpost);

		if (admin_board->posts.size() > static_cast<std::size_t>(static_cast<int>(this->config["AdminBoardLimit"])))
		{
			admin_board->posts.pop_back();
		}
	}
}